

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t ra_portable_deserialize_size(char *buf,size_t maxbytes)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  size_t containersize_2;
  size_t containersize_1;
  uint16_t n_runs;
  size_t containersize;
  _Bool isrun;
  _Bool isbitmap;
  uint32_t thiscard;
  uint16_t tmp;
  int32_t k;
  uint16_t *keyscards;
  int32_t s;
  _Bool hasrun;
  char *bitmapOfRunContainers;
  int32_t size;
  uint32_t cookie;
  size_t bytestotal;
  size_t maxbytes_local;
  char *buf_local;
  
  _size = (char *)0x4;
  if (maxbytes < 4) {
    buf_local = (char *)0x0;
  }
  else {
    uVar3 = *(uint *)buf;
    maxbytes_local = (size_t)(buf + 4);
    if (((uVar3 & 0xffff) == 0x303b) || (uVar3 == 0x303a)) {
      if ((uVar3 & 0xffff) == 0x303b) {
        bitmapOfRunContainers._0_4_ = (uVar3 >> 0x10) + 1;
      }
      else {
        _size = (char *)0x8;
        if (maxbytes < 8) {
          return 0;
        }
        bitmapOfRunContainers._0_4_ = *(int *)maxbytes_local;
        maxbytes_local = (size_t)(buf + 8);
      }
      if ((int)bitmapOfRunContainers < 0x10001) {
        _s = 0;
        bVar5 = (uVar3 & 0xffff) == 0x303b;
        if (bVar5) {
          iVar2 = ((int)bitmapOfRunContainers + 7) / 8;
          _size = (char *)((long)iVar2 + (long)_size);
          if (maxbytes < _size) {
            return 0;
          }
          _s = maxbytes_local;
          maxbytes_local = maxbytes_local + (long)iVar2;
        }
        sVar1 = maxbytes_local;
        _size = (char *)((long)((int)bitmapOfRunContainers << 1) * 2 + (long)_size);
        if (maxbytes < _size) {
          buf_local = (char *)0x0;
        }
        else {
          maxbytes_local = (long)((int)bitmapOfRunContainers << 1) * 2 + maxbytes_local;
          if ((!bVar5) || (3 < (int)bitmapOfRunContainers)) {
            _size = _size + ((int)bitmapOfRunContainers << 2);
            if (maxbytes < _size) {
              return 0;
            }
            maxbytes_local = maxbytes_local + (long)((int)bitmapOfRunContainers << 2);
          }
          for (thiscard = 0; (int)thiscard < (int)bitmapOfRunContainers; thiscard = thiscard + 1) {
            uVar3 = *(ushort *)(sVar1 + 2 + (long)(int)(thiscard << 1) * 2) + 1;
            containersize._3_1_ = 0x1000 < uVar3;
            bVar6 = false;
            if (bVar5) {
              bVar6 = ((int)*(char *)(_s + (long)((int)thiscard / 8)) &
                      1 << ((byte)((long)(int)thiscard % 8) & 0x1f)) != 0;
              containersize._3_1_ = !bVar6 && containersize._3_1_;
            }
            if (containersize._3_1_) {
              _size = _size + 0x2000;
              if (maxbytes < _size) {
                return 0;
              }
              maxbytes_local = maxbytes_local + 0x2000;
            }
            else if (bVar6) {
              if (maxbytes < _size + 2) {
                return 0;
              }
              _size = _size + 2 + (ulong)*(ushort *)maxbytes_local * 4;
              if (maxbytes < _size) {
                return 0;
              }
              maxbytes_local = (ulong)*(ushort *)maxbytes_local * 4 + maxbytes_local + 2;
            }
            else {
              lVar4 = (ulong)uVar3 * 2;
              _size = _size + lVar4;
              if (maxbytes < _size) {
                return 0;
              }
              maxbytes_local = lVar4 + maxbytes_local;
            }
          }
          buf_local = _size;
        }
      }
      else {
        buf_local = (char *)0x0;
      }
    }
    else {
      buf_local = (char *)0x0;
    }
  }
  return (size_t)buf_local;
}

Assistant:

size_t ra_portable_deserialize_size(const char *buf, const size_t maxbytes) {
    size_t bytestotal = sizeof(int32_t);// for cookie
    if(bytestotal > maxbytes) return 0;
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        return 0;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        bytestotal += sizeof(int32_t);
        if(bytestotal > maxbytes) return 0;
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size > (1<<16)) {
       return 0; // logically impossible
    }
    char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        bytestotal += s;
        if(bytestotal > maxbytes) return 0;
        bitmapOfRunContainers = (char *)buf;
        buf += s;
    }
    bytestotal += size * 2 * sizeof(uint16_t);
    if(bytestotal > maxbytes) return 0;
    uint16_t *keyscards = (uint16_t *)buf;
    buf += size * 2 * sizeof(uint16_t);
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        // skipping the offsets
        bytestotal += size * 4;
        if(bytestotal > maxbytes) return 0;
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2*k+1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if(hasrun) {
          if((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
            isbitmap = false;
            isrun = true;
          }
        }
        if (isbitmap) {
            size_t containersize = BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            bytestotal += containersize;
            if(bytestotal > maxbytes) return 0;
            buf += containersize;
        } else if (isrun) {
            bytestotal += sizeof(uint16_t);
            if(bytestotal > maxbytes) return 0;
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            buf += sizeof(uint16_t);
            size_t containersize = n_runs * sizeof(rle16_t);
            bytestotal += containersize;
            if(bytestotal > maxbytes) return 0;
            buf += containersize;
        } else {
            size_t containersize = thiscard * sizeof(uint16_t);
            bytestotal += containersize;
            if(bytestotal > maxbytes) return 0;
            buf += containersize;
        }
    }
    return bytestotal;
}